

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

char * BN_bn2dec(BIGNUM *a)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  BIGNUM *a_00;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *data;
  size_t len;
  ScopedCBB cbb;
  uint8_t *local_70;
  size_t local_68;
  CBB local_60;
  
  CBB_zero(&local_60);
  iVar2 = CBB_init(&local_60,0x10);
  if (iVar2 != 0) {
    iVar2 = CBB_add_u8(&local_60,'\0');
    puVar9 = (uint8_t *)0x0;
    if (iVar2 == 0) goto LAB_00175d02;
    iVar2 = BN_is_zero((BIGNUM *)a);
    if (iVar2 == 0) {
      a_00 = BN_dup(a);
      if (a_00 != (BIGNUM *)0x0) {
        while( true ) {
          iVar2 = BN_is_zero((BIGNUM *)a_00);
          if (iVar2 != 0) {
            BN_free(a_00);
            goto LAB_00175c78;
          }
          uVar4 = BN_div_word(a_00,10000000000000000000);
          if (uVar4 == 0xffffffffffffffff) break;
          iVar2 = BN_is_zero((BIGNUM *)a_00);
          if (iVar2 == 0 || uVar4 != 0) {
            uVar6 = 0;
            do {
              uVar7 = uVar4;
              iVar3 = CBB_add_u8(&local_60,(char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30);
              if (iVar3 == 0) goto LAB_00175cf7;
            } while ((uVar6 < 0x12) &&
                    (uVar6 = uVar6 + 1, uVar4 = uVar7 / 10, iVar2 == 0 || 9 < uVar7));
            if (9 < uVar7) {
              __assert_fail("word == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bn/convert.cc"
                            ,0xe6,"char *BN_bn2dec(const BIGNUM *)");
            }
          }
        }
LAB_00175cf7:
        BN_free(a_00);
      }
    }
    else {
      iVar2 = CBB_add_u8(&local_60,'0');
      if (iVar2 != 0) {
LAB_00175c78:
        iVar2 = BN_is_negative((BIGNUM *)a);
        if (((iVar2 == 0) || (iVar2 = CBB_add_u8(&local_60,'-'), iVar2 != 0)) &&
           (iVar2 = CBB_finish(&local_60,&local_70,&local_68), iVar2 != 0)) {
          puVar5 = local_70 + (local_68 - 1);
          puVar9 = local_70;
          if (local_70 < puVar5 && local_68 != 0) {
            do {
              puVar8 = local_70 + 1;
              uVar1 = *local_70;
              *local_70 = *puVar5;
              *puVar5 = uVar1;
              puVar5 = puVar5 + -1;
              local_70 = puVar8;
            } while (puVar8 < puVar5);
          }
          goto LAB_00175d02;
        }
      }
    }
  }
  puVar9 = (uint8_t *)0x0;
LAB_00175d02:
  CBB_cleanup(&local_60);
  return (char *)puVar9;
}

Assistant:

char *BN_bn2dec(const BIGNUM *a) {
  // It is easier to print strings little-endian, so we assemble it in reverse
  // and fix at the end.
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 16) || //
      !CBB_add_u8(cbb.get(), 0 /* trailing NUL */)) {
    return nullptr;
  }

  if (BN_is_zero(a)) {
    if (!CBB_add_u8(cbb.get(), '0')) {
      return nullptr;
    }
  } else {
    bssl::UniquePtr<BIGNUM> copy(BN_dup(a));
    if (copy == nullptr) {
      return nullptr;
    }

    while (!BN_is_zero(copy.get())) {
      BN_ULONG word = BN_div_word(copy.get(), BN_DEC_CONV);
      if (word == (BN_ULONG)-1) {
        return nullptr;
      }

      const int add_leading_zeros = !BN_is_zero(copy.get());
      for (int i = 0; i < BN_DEC_NUM && (add_leading_zeros || word != 0); i++) {
        if (!CBB_add_u8(cbb.get(), '0' + word % 10)) {
          return nullptr;
        }
        word /= 10;
      }
      assert(word == 0);
    }
  }

  if (BN_is_negative(a) && //
      !CBB_add_u8(cbb.get(), '-')) {
    return nullptr;
  }

  uint8_t *data;
  size_t len;
  if (!CBB_finish(cbb.get(), &data, &len)) {
    return nullptr;
  }

  std::reverse(data, data + len);
  return reinterpret_cast<char *>(data);
}